

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O2

int __thiscall adjMaxtrix<char>::GetNextVex(adjMaxtrix<char> *this,int v1,int v2)

{
  ulong uVar1;
  ulong uVar2;
  
  if (-1 < v1) {
    uVar1 = (long)(this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar2 = (ulong)(uint)v2;
    if ((uVar2 < uVar1 && (uint)v1 < uVar1) && -1 < v2) {
      do {
        uVar2 = uVar2 + 1;
        if (uVar1 <= uVar2) {
          return -1;
        }
        v2 = v2 + 1;
      } while (this->edge[(uint)v1][uVar2] == this->MAX_WEIGHT);
      return v2;
    }
  }
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_2900);
  return -1;
}

Assistant:

int adjMaxtrix<dataType>::GetNextVex(int v1, int v2) {
	int col;
	if (v1 < 0 || v1 >= vexs.size() || v2 < 0 || v2 >= vexs.size()) {
		cout << "参数v1或v2越界";
		return -1;
	}
	//查找v顶点的，也就是第v行的第一个有效顶点，放回其列col
	for (col = v2 + 1; col < vexs.size(); col++) {
		if (edge[v1][col] != MAX_WEIGHT)
			return col;
	}
	return -1;
}